

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

void adios2::utils::mergeLists(int nV,char **listV,int nA,char **listA,char **mlist,bool *isVar)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  char *__s2;
  char *__s1;
  
  if (((sortnames == '\0') || (listattrs != '\x01')) || ((attrsonly & 1) != 0)) {
    uVar2 = 0;
    if ((attrsonly & 1) == 0) {
      uVar3 = uVar2;
      uVar7 = (ulong)(uint)nV;
      if (nV < 1) {
        uVar7 = uVar2;
      }
      for (; uVar2 = uVar7, uVar2 != uVar3; uVar3 = uVar3 + 1) {
        mlist[uVar3] = listV[uVar3];
        isVar[uVar3] = true;
        uVar7 = uVar2;
      }
    }
    if (listattrs == '\x01') {
      uVar7 = 0;
      uVar3 = (ulong)(uint)nA;
      if (nA < 1) {
        uVar3 = uVar7;
      }
      for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        mlist[uVar2 + uVar7] = listA[uVar7];
        isVar[uVar7 + uVar2] = false;
      }
    }
    return;
  }
  uVar6 = 0;
  lVar5 = 0;
  do {
    lVar5 = (long)(int)lVar5;
    while( true ) {
      iVar4 = (int)lVar5;
      if ((nV <= (int)uVar6) && (nA <= iVar4)) {
        return;
      }
      if (nA <= iVar4) break;
      if ((int)uVar6 < nV) {
        __s1 = listV[uVar6];
        __s2 = listA[lVar5];
        iVar1 = strcmp(__s1,__s2);
        if (iVar1 < 1) goto LAB_0011b3c2;
      }
      else {
        __s2 = listA[lVar5];
      }
      mlist[(int)(uVar6 + iVar4)] = __s2;
      isVar[(int)(uVar6 + iVar4)] = false;
      lVar5 = lVar5 + 1;
    }
    __s1 = listV[uVar6];
LAB_0011b3c2:
    mlist[(int)(uVar6 + iVar4)] = __s1;
    isVar[(int)(uVar6 + iVar4)] = true;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void mergeLists(int nV, char **listV, int nA, char **listA, char **mlist, bool *isVar)
{
    int v, a, idx;
    if (sortnames && listattrs && !attrsonly)
    {
        // merge sort the two lists
        v = 0;
        a = 0;
        while (v < nV || a < nA)
        {
            if (a < nA && (v >= nV || strcmp(listV[v], listA[a]) > 0))
            {
                // fully consumed var list or
                // next item in attr list is less than next item in var list
                mlist[v + a] = listA[a];
                isVar[v + a] = false;
                a++;
            }
            else
            {
                mlist[v + a] = listV[v];
                isVar[v + a] = true;
                v++;
            }
        }
    }
    else
    {
        // first add vars then attrs (if ask ed)
        idx = 0;
        if (!attrsonly)
        {
            for (v = 0; v < nV; v++)
            {
                mlist[idx] = listV[v];
                isVar[idx] = true;
                idx++;
            }
        }
        if (listattrs)
        {
            for (a = 0; a < nA; a++)
            {
                mlist[idx] = listA[a];
                isVar[idx] = false;
                idx++;
            }
        }
    }
}